

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# deMemPool.c
# Opt level: O0

void * deMemPool_alloc(deMemPool *pool,size_t numBytes)

{
  void *pvVar1;
  void *ptr;
  size_t numBytes_local;
  deMemPool *pool_local;
  
  pvVar1 = deMemPool_allocInternal(pool,numBytes,8);
  if ((pvVar1 == (void *)0x0) && (pool->util != (deMemPoolUtil *)0x0)) {
    (*pool->util->allocFailCallback)(pool->util->userPointer);
  }
  return pvVar1;
}

Assistant:

void* deMemPool_alloc (deMemPool* pool, size_t numBytes)
{
	void* ptr;
	DE_ASSERT(pool);
	DE_ASSERT(numBytes > 0);
	ptr = deMemPool_allocInternal(pool, numBytes, DE_POOL_DEFAULT_ALLOC_ALIGNMENT);
	if (!ptr && pool->util)
		pool->util->allocFailCallback(pool->util->userPointer);
	return ptr;
}